

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O2

void Sbc_SimMult(word *A,word *B,word *R,int nIns)

{
  long lVar1;
  ulong uVar2;
  word wVar3;
  ulong uVar4;
  ulong a;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong b;
  word r [2];
  
  if (0x40 < (uint)nIns) {
    __assert_fail("nBits >= 0 && nBits <= 64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                  ,0xc2,"word Abc_Tt6Mask(int)");
  }
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    R[lVar1 + 0x40] = 0;
    R[lVar1] = 0;
    B[lVar1] = 0;
    A[lVar1] = 0;
  }
  uVar2 = 0xffffffffffffffff >> (0x40U - (char)nIns & 0x3f);
  Gia_ManRandom(1);
  uVar7 = 0;
  do {
    a = uVar7;
    b = uVar7;
    if (uVar7 != 0) {
      if (uVar7 == 0x40) {
        return;
      }
      wVar3 = Gia_ManRandomW(0);
      a = wVar3 & uVar2;
      wVar3 = Gia_ManRandomW(0);
      b = wVar3 & uVar2;
    }
    Sbc_Mult(a,b,r);
    uVar5 = 1L << ((byte)uVar7 & 0x3f);
    for (uVar4 = 0; uVar4 != 0x40; uVar4 = uVar4 + 1) {
      uVar6 = 1L << ((byte)uVar4 & 0x3f);
      if ((a >> (uVar4 & 0x3f) & 1) != 0) {
        A[uVar4] = A[uVar4] | uVar5;
      }
      if ((uVar6 & b) != 0) {
        B[uVar4] = B[uVar4] | uVar5;
      }
      if ((r[0] & uVar6) != 0) {
        R[uVar4] = R[uVar4] | uVar5;
      }
      if ((r[1] & uVar6) != 0) {
        R[uVar4 + 0x40] = R[uVar4 + 0x40] | uVar5;
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void Sbc_SimMult( word A[64], word B[64], word R[128], int nIns )
{
    word a, b, r[2], Mask = Abc_Tt6Mask(nIns); int i, k;
    for ( i = 0; i < 64; i++ )
        A[i] = B[i] = R[i] = R[i+64] = 0;
    Gia_ManRandom(1);
    for ( i = 0; i < 64; i++ )
    {
        a = i ? (Mask & Gia_ManRandomW(0)) : 0;
        b = i ? (Mask & Gia_ManRandomW(0)) : 0;        
        Sbc_Mult( a, b, r );
        for ( k = 0; k < 64; k++ )
        {
            if ( (a    >> k) & 1 )  A[k]    |= ((word)1 << i);
            if ( (b    >> k) & 1 )  B[k]    |= ((word)1 << i);
            if ( (r[0] >> k) & 1 )  R[k]    |= ((word)1 << i);
            if ( (r[1] >> k) & 1 )  R[k+64] |= ((word)1 << i);
        }
    }
//    for ( i = 0; i < 128; i++ )
//        for ( k = 0; k < 64; k++, printf( "\n" ) )
//            printf( "%d", (R[i] >> k) & 1 );
}